

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O0

Value * __thiscall GlobOpt::NewInt64ConstantValue(GlobOpt *this,int64 intConst,Instr *instr)

{
  code *pcVar1;
  bool bVar2;
  ValueInfo *pVVar3;
  Sym *pSVar4;
  Opnd *this_00;
  StackSym *this_01;
  undefined4 *puVar5;
  StackSym *sym;
  Value *value;
  Instr *instr_local;
  int64 intConst_local;
  GlobOpt *this_local;
  
  value = (Value *)instr;
  instr_local = (Instr *)intConst;
  intConst_local = (int64)this;
  pVVar3 = (ValueInfo *)Int64ConstantValueInfo::New(this->alloc,intConst);
  sym = (StackSym *)NewValue(this,pVVar3);
  JsUtil::
  BaseDictionary<long,_Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  ::Item(this->int64ConstantToValueMap,(long *)&instr_local,(Value **)&sym);
  pVVar3 = ::Value::GetValueInfo((Value *)sym);
  pSVar4 = ValueInfo::GetSymStore(pVVar3);
  if ((pSVar4 == (Sym *)0x0) &&
     (((short)value[3].valueNumber == 0x1e5 || ((short)value[3].valueNumber == 0x1e4)))) {
    this_00 = IR::Instr::GetDst((Instr *)value);
    this_01 = IR::Opnd::GetStackSym(this_00);
    if ((this_01 == (StackSym *)0x0) || (bVar2 = StackSym::IsTypeSpec(this_01), bVar2)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                         ,0x10d5,"(sym && !sym->IsTypeSpec())","sym && !sym->IsTypeSpec()");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 0;
    }
    GlobOptBlockData::SetValue(&this->currentBlock->globOptData,(Value *)sym,&this_01->super_Sym);
    BVSparse<Memory::JitArenaAllocator>::Set
              ((this->currentBlock->globOptData).liveVarSyms,(this_01->super_Sym).m_id);
  }
  return (Value *)sym;
}

Assistant:

Value *
GlobOpt::NewInt64ConstantValue(const int64 intConst, IR::Instr* instr)
{
    Value * value = NewValue(Int64ConstantValueInfo::New(this->alloc, intConst));
    this->int64ConstantToValueMap->Item(intConst, value);

    if (!value->GetValueInfo()->GetSymStore() &&
        (instr->m_opcode == Js::OpCode::LdC_A_I4 || instr->m_opcode == Js::OpCode::Ld_I4))
    {
        StackSym * sym = instr->GetDst()->GetStackSym();
        Assert(sym && !sym->IsTypeSpec());
        this->currentBlock->globOptData.SetValue(value, sym);
        this->currentBlock->globOptData.liveVarSyms->Set(sym->m_id);
    }
    return value;
}